

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::(anonymous_namespace)::DatarateTestSVC_SetFrameQpSVC3TL1SL_Test::
~DatarateTestSVC_SetFrameQpSVC3TL1SL_Test(DatarateTestSVC_SetFrameQpSVC3TL1SL_Test *this)

{
  DatarateTestSVC_SetFrameQpSVC3TL1SL_Test *in_stack_00000010;
  
  anon_unknown_0::DatarateTestSVC_SetFrameQpSVC3TL1SL_Test::
  ~DatarateTestSVC_SetFrameQpSVC3TL1SL_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(DatarateTestSVC, SetFrameQpSVC3TL1SL) { SetFrameQpSVC3TL1SLTest(); }